

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O1

PreservedAnalyses * __thiscall
GlobalToStack::run(PreservedAnalyses *__return_storage_ptr__,GlobalToStack *this,Module *M,
                  ModuleAnalysisManager *AM)

{
  void **ppvVar1;
  char *pcVar2;
  Function *pFVar3;
  SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
  *this_00;
  ulong uVar4;
  Module *V;
  SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
  *pSVar5;
  Module *pMVar6;
  PreservedAnalyses *PA;
  SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U> Usage;
  Value *local_218;
  Function *local_210;
  MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  local_208;
  
  local_208.Map._0_1_ = local_208.Map._0_1_ | 1;
  llvm::
  DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::Function_*,_unsigned_int,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>
  ::initEmpty((DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::Function_*,_unsigned_int,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>
               *)&local_208);
  local_208.Vector.
  super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
  .
  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
  .super_SmallVectorBase<unsigned_int>.BeginX =
       &local_208.Vector.
        super_SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
  ;
  local_208.Vector.
  super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
  .
  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
  .super_SmallVectorBase<unsigned_int>.Size = 0;
  local_208.Vector.
  super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
  .
  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
  .super_SmallVectorBase<unsigned_int>.Capacity = 4;
  pMVar6 = *(Module **)(M + 0x10);
  if (pMVar6 != M + 8) {
    do {
      V = pMVar6 + -0x38;
      if (pMVar6 == (Module *)0x0) {
        V = (Module *)0x0;
      }
      if (((*(uint *)((Value *)V + 0x20) & 0xf) < 9) &&
         ((0x18eU >> (*(uint *)((Value *)V + 0x20) & 0xf) & 1) != 0)) {
        pFVar3 = getUsingFunction((Value *)V);
        if (pFVar3 != (Function *)0x0) {
          local_210 = getUsingFunction((Value *)V);
          this_00 = &llvm::
                     MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                     ::operator[](&local_208,&local_210)->
                     super_SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
          ;
          local_218 = (Value *)V;
          llvm::
          SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
          ::insert(this_00,(value_type *)&local_218);
        }
      }
      pMVar6 = *(Module **)(pMVar6 + 8);
    } while (pMVar6 != M + 8);
  }
  uVar4 = local_208.Vector.
          super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
          .
          super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
          .
          super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
          .super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
  if (uVar4 != 0) {
    pcVar2 = (char *)local_208.Vector.
                     super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
                     .
                     super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
                     .
                     super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
                     .super_SmallVectorBase<unsigned_int>.BeginX;
    pSVar5 = (SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
              *)local_208.Vector.
                super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
                .
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
                .super_SmallVectorBase<unsigned_int>.BeginX;
    do {
      inlineGlobals(this,*(Function **)pSVar5->InlineElts,
                    (SmallSetVector<llvm::GlobalVariable_*,_4U> *)(pSVar5->InlineElts + 8));
      pSVar5 = (SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
                *)(pSVar5->InlineElts + 0x60);
    } while (pSVar5 != (SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
                        *)(pcVar2 + uVar4 * 0x60));
  }
  if (local_208.Vector.
      super_SmallVectorImpl<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>_>
      .
      super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_false>
      .
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_void>
      .super_SmallVectorBase<unsigned_int>.Size == 0) {
    llvm::PreservedAnalyses::all();
  }
  else {
    ppvVar1 = (__return_storage_ptr__->PreservedIDs).SmallStorage;
    (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.super_SmallPtrSetImplBase.
    SmallArray = ppvVar1;
    (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.super_SmallPtrSetImplBase.
    CurArray = ppvVar1;
    (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.super_SmallPtrSetImplBase.
    CurArraySize = 2;
    (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.super_SmallPtrSetImplBase.
    NumNonEmpty = 0;
    (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.super_SmallPtrSetImplBase.
    NumTombstones = 0;
    ppvVar1 = (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage;
    (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>.
    super_SmallPtrSetImplBase.SmallArray = ppvVar1;
    (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>.
    super_SmallPtrSetImplBase.CurArray = ppvVar1;
    (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>.
    super_SmallPtrSetImplBase.CurArraySize = 2;
    (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>.
    super_SmallPtrSetImplBase.NumNonEmpty = 0;
    (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>.
    super_SmallPtrSetImplBase.NumTombstones = 0;
    llvm::PreservedAnalyses::preserveSet
              (__return_storage_ptr__,(AnalysisSetKey *)&llvm::CFGAnalyses::SetKey);
  }
  llvm::
  SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>::
  ~SmallVector(&local_208.Vector);
  llvm::
  SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>
  ::deallocateBuckets(&local_208.Map);
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses GlobalToStack::run(Module &M,
                                           ModuleAnalysisManager &AM) {

  SmallMapVector<Function *, SmallSetVector<GlobalVariable *, 4>, 4> Usage;

  for (GlobalVariable &G : M.globals())
    if (shouldInline(G))
      Usage[getUsingFunction(G)].insert(&G);

  for (auto &KV : Usage)
    inlineGlobals(KV.first, KV.second);

  if (Usage.empty()) {
    return llvm::PreservedAnalyses::all();
  }

  llvm::PreservedAnalyses PA;
  PA.preserveSet<CFGAnalyses>();
  return PA;
}